

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamMemory.cpp
# Opt level: O2

size_t __thiscall Rml::StreamMemory::Truncate(StreamMemory *this,size_t bytes)

{
  ulong uVar1;
  
  uVar1 = this->buffer_used;
  if (uVar1 < bytes) {
    return 0;
  }
  this->buffer_used = bytes;
  this->buffer_ptr = this->buffer + bytes;
  return uVar1 - bytes;
}

Assistant:

size_t StreamMemory::Truncate(size_t bytes)
{
	if (bytes > buffer_used)
		return 0;

	size_t old_size = buffer_used;
	buffer_used = bytes;
	buffer_ptr = buffer + bytes;
	return old_size - buffer_used;
}